

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O0

vec3 __thiscall vera::Camera::worldToScreen(Camera *this,vec3 *_world,mat4 *_model)

{
  vec3 vVar1;
  undefined8 extraout_XMM0_Qa;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 in_XMM1_Da;
  mat4 *_model_local;
  vec3 *_world_local;
  Camera *this_local;
  vec3 screen;
  
  (*(this->super_Node)._vptr_Node[0x45])(this,_world,_model);
  this_local._0_4_ = (float)extraout_XMM0_Qa;
  this_local._4_4_ = (float)((ulong)extraout_XMM0_Qa >> 0x20);
  this_local = (Camera *)CONCAT44((1.0 - this_local._4_4_) * 0.5,(this_local._0_4_ + 1.0) * 0.5);
  vVar1.field_2 = in_XMM1_Da;
  vVar1._0_8_ = this_local;
  return vVar1;
}

Assistant:

glm::vec3 Camera::worldToScreen(const glm::vec3* _world, glm::mat4* _model) const { 
    glm::vec3 screen = worldToCamera(_world, _model);
    screen.x = (screen.x + 1.0f) * 0.5f;
    screen.y = (1.0f - screen.y) * 0.5f;
    // screen.x *= vera::getWindowWidth();
    // screen.y *= vera::getWindowHeight();
    return screen;
}